

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

int get_byte(MIR_context_t ctx)

{
  int iVar1;
  MIR_error_func_t p_Var2;
  int c;
  MIR_context_t ctx_local;
  
  iVar1 = reduce_decode_get(ctx->io_ctx->io_reduce_data);
  if (iVar1 == -1) {
    p_Var2 = MIR_get_error_func(ctx);
    (*p_Var2)(MIR_binary_io_error,"unfinished binary MIR");
  }
  return iVar1;
}

Assistant:

static int get_byte (MIR_context_t ctx) {
#ifdef MIR_NO_BIN_COMPRESSION
  int c = io_reader (ctx);
#else
  int c = reduce_decode_get (io_reduce_data);
#endif

  if (c == EOF) MIR_get_error_func (ctx) (MIR_binary_io_error, "unfinished binary MIR");
  return c;
}